

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>::
merge<ft::less<std::__cxx11::string>>
          (list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *this,
          list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *x,undefined8 param_3,
          undefined8 param_4,__off64_t *param_5,size_t param_6)

{
  int iVar1;
  long lVar2;
  uint in_stack_ffffffffffffffa8;
  undefined **local_50;
  long local_48;
  undefined **local_40;
  undefined8 local_38;
  
  if ((this != x) && (*(long *)(x + 0x10) != 0)) {
    lVar2 = *(long *)(*(long *)this + 0x28);
    do {
      if (lVar2 == *(long *)(this + 8)) {
LAB_001097b8:
        local_50 = &PTR__listIterator_0010dce0;
        local_38 = *(undefined8 *)(*(long *)x + 0x28);
        local_40 = &PTR__listIterator_0010dce0;
        local_48 = lVar2;
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::splice((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,(int)&local_50,(__off64_t *)x,(int)&local_40,param_5,param_6,
                 in_stack_ffffffffffffffa8);
      }
      else {
        iVar1 = std::__cxx11::string::compare(*(string **)(*(long *)x + 0x28));
        if (iVar1 < 0) goto LAB_001097b8;
        lVar2 = *(long *)(lVar2 + 0x28);
      }
    } while (*(long *)(x + 0x10) != 0);
  }
  return;
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}